

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberobserver.cpp
# Opt level: O2

void __thiscall NumberObserver::onNotified(NumberObserver *this)

{
  DataTable *this_00;
  ulong in_RAX;
  int i;
  uint index;
  int data;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  for (index = 0; this_00 = (this->super_DataTableObserver)._table,
      (int)index <
      (int)((ulong)((long)(this_00->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this_00->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2); index = index + 1) {
    DataTable::get(this_00,index,(int *)((long)&uStack_28 + 4));
    printf("%d: %d\n",(ulong)index,uStack_28 >> 0x20);
  }
  return;
}

Assistant:

void NumberObserver::onNotified()
{
	for (int i = 0; i < _table->count(); ++i) {
		int data;
		_table->get(i, &data);
		printData(data, i);
	}
}